

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

void __thiscall CompressedArray::dump(CompressedArray *this,ostream *out)

{
  const_reference cVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  uint32_t i_1;
  uint32_t size;
  uint8_t idx;
  uint8_t buffer;
  uint32_t i;
  uint32_t blocks_count;
  ostream *in_stack_ffffffffffffffb8;
  vector<bool,_std::allocator<bool>_> *pvVar4;
  Vocabulary<unsigned_int> *in_stack_ffffffffffffffc0;
  vector<bool,_std::allocator<bool>_> *pvVar5;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc8;
  uint local_24;
  undefined4 local_20;
  byte local_1a;
  byte local_19;
  uint local_18;
  uint local_14;
  
  std::ostream::write((char *)in_RSI,
                      (long)&(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  std::ostream::write((char *)in_RSI,
                      (long)&(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base.field_0xc);
  std::ostream::write((char *)in_RSI,
                      (long)&(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish);
  std::ostream::write((char *)in_RSI,
                      (long)((long)&(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                            + 4));
  std::ostream::write((char *)in_RSI,
                      (long)&(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  std::ostream::write((char *)in_RSI,
                      (long)&(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base.field_0xc);
  std::ostream::write((char *)in_RSI,
                      (long)&in_RDI[4].super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage);
  Vocabulary<unsigned_int>::dump(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Vocabulary<unsigned_int>::dump(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Vocabulary<unsigned_int>::dump(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sVar2 = std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
          size((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                *)&in_RDI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage);
  local_14 = (uint)sVar2;
  std::ostream::write((char *)in_RSI,(long)&local_14);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    pvVar4 = in_RSI;
    pvVar3 = std::
             vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
             operator[]((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                         *)&in_RDI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage,(ulong)local_18);
    std::ostream::write((char *)in_RSI,(long)pvVar3);
    pvVar5 = pvVar4;
    pvVar3 = std::
             vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
             operator[]((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                         *)&in_RDI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage,(ulong)local_18);
    std::ostream::write((char *)pvVar4,(long)&(pvVar3->key).context_index);
    in_stack_ffffffffffffffc8 = pvVar5;
    pvVar3 = std::
             vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
             operator[]((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                         *)&in_RDI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage,(ulong)local_18);
    std::ostream::write((char *)pvVar5,(long)&pvVar3->offset);
    in_RSI = in_stack_ffffffffffffffc8;
    pvVar3 = std::
             vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
             operator[]((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                         *)&in_RDI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage,(ulong)local_18);
    std::ostream::write((char *)in_stack_ffffffffffffffc8,(long)&pvVar3->record_index);
  }
  local_19 = 0;
  local_1a = 0;
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_RSI);
  local_20 = (undefined4)sVar2;
  std::ostream::write((char *)in_RSI,(long)&local_20);
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_RSI);
    if (sVar2 <= local_24) break;
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_RDI,(size_type)in_stack_ffffffffffffffc8);
    local_19 = local_19 | cVar1 << (local_1a & 0x1f);
    local_1a = local_1a + 1;
    if (local_1a == 8) {
      std::ostream::write((char *)in_RSI,(long)&local_19);
      local_1a = 0;
      local_19 = 0;
    }
    local_24 = local_24 + 1;
  }
  if (local_1a != 0) {
    std::ostream::write((char *)in_RSI,(long)&local_19);
  }
  return;
}

Assistant:

void CompressedArray::dump(ostream& out) const {
    out.write((char*)(&word_index_diff_log_radix), sizeof(word_index_diff_log_radix));
    out.write((char*)(&context_index_diff_log_radix), sizeof(context_index_diff_log_radix));
    out.write((char*)(&context_index_log_radix), sizeof(context_index_log_radix));
    out.write((char*)(&ngram_count_index_log_radix), sizeof(ngram_count_index_log_radix));
    out.write((char*)(&continuations_count_index_log_radix),
              sizeof(continuations_count_index_log_radix));
    out.write((char*)(&unique_continuations_count_index_log_radix),
              sizeof(unique_continuations_count_index_log_radix));

    out.write((char*)(&record_count), sizeof(record_count));

    ngram_count_values.dump(out);
    continuations_count_values.dump(out);
    unique_continuations_count_values.dump(out);

    uint32_t blocks_count = uint32_t(headers.size());
    out.write((char*)(&blocks_count), sizeof(blocks_count));
    for (uint32_t i = 0; i < blocks_count; i++) {
        out.write((char*)(&headers[i].key.word_index), sizeof(headers[i].key.word_index));
        out.write((char*)(&headers[i].key.context_index), sizeof(headers[i].key.context_index));
        out.write((char*)(&headers[i].offset), sizeof(headers[i].offset));
        out.write((char*)(&headers[i].record_index), sizeof(headers[i].record_index));
    }

    uint8_t buffer = 0;
    uint8_t idx = 0;
    uint32_t size = uint32_t(data.size());
    out.write((char*)(&size), sizeof(size));
    for (uint32_t i = 0; i < data.size(); i++) {
        buffer |= data[i] << idx;
        idx++;
        if (idx == 8) {
            out.write((char*)(&buffer), sizeof(buffer));
            idx = 0;
            buffer = 0;
        }
    }
    if (idx > 0)
        out.write((char*)(&buffer), sizeof(buffer));
}